

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Glob.cxx
# Opt level: O1

bool __thiscall
kwssys::Glob::RecurseDirectory(Glob *this,size_type start,string *dir,GlobMessages *messages)

{
  pointer pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  pointer pRVar3;
  pointer pbVar4;
  size_type sVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  Status SVar9;
  long *plVar10;
  unsigned_long uVar11;
  char *__s;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var12;
  undefined8 *puVar13;
  size_type *psVar14;
  _Alloc_hider _Var15;
  RegularExpression *this_00;
  ulong *puVar16;
  ulong i;
  bool bVar17;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string message;
  string fname;
  string realname;
  string canonicalPath;
  Directory d;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_2;
  string errorMessage;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1a8;
  _Alloc_hider local_1a0;
  undefined1 local_198 [24];
  string local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_160;
  ulong local_158;
  ulong *local_150;
  long local_148;
  ulong local_140;
  undefined4 uStack_138;
  undefined4 uStack_134;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  string local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  Directory local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_a8;
  size_type local_a0;
  size_type local_98;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_98 = start;
  Directory::Directory(&local_d0);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  local_160 = dir;
  SVar9 = Directory::Load(&local_d0,dir,&local_90);
  if (SVar9.Kind_ == Success) {
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    local_110._M_string_length = 0;
    local_110.field_2._M_allocated_capacity =
         local_110.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    local_130._M_string_length = 0;
    local_158 = 0;
    local_130.field_2._M_allocated_capacity =
         local_130.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_a0 = local_98 + 1;
    local_a8 = &this->VisitedSymlinks;
    while( true ) {
      uVar11 = Directory::GetNumberOfFiles(&local_d0);
      bVar17 = uVar11 <= local_158;
      if (bVar17) break;
      __s = Directory::GetFile(&local_d0,local_158);
      sVar5 = local_130._M_string_length;
      strlen(__s);
      std::__cxx11::string::_M_replace((ulong)&local_130,0,(char *)sVar5,(ulong)__s);
      iVar8 = std::__cxx11::string::compare((char *)&local_130);
      if ((iVar8 != 0) && (iVar8 = std::__cxx11::string::compare((char *)&local_130), iVar8 != 0)) {
        if (local_98 == 0) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_1a8,local_160,&local_130);
          i = local_158;
          std::__cxx11::string::operator=((string *)&local_110,(string *)&local_1a8);
          _Var15._M_p = (pointer)local_1a8;
          if (local_1a8 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_198) goto LAB_0015e8b9;
        }
        else {
          local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
          pcVar1 = (local_160->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_180,pcVar1,pcVar1 + local_160->_M_string_length);
          i = local_158;
          std::__cxx11::string::append((char *)&local_180);
          plVar10 = (long *)std::__cxx11::string::_M_append
                                      ((char *)&local_180,(ulong)local_130._M_dataplus._M_p);
          psVar14 = (size_type *)(plVar10 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar10 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar14) {
            local_198._0_8_ = *psVar14;
            local_198._8_8_ = plVar10[3];
            local_1a8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_198;
          }
          else {
            local_198._0_8_ = *psVar14;
            local_1a8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*plVar10;
          }
          local_1a0._M_p = (pointer)plVar10[1];
          *plVar10 = (long)psVar14;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          std::__cxx11::string::operator=((string *)&local_110,(string *)&local_1a8);
          if (local_1a8 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_198) {
            operator_delete(local_1a8);
          }
          _Var15._M_p = local_180._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_180._M_dataplus._M_p != &local_180.field_2) {
LAB_0015e8b9:
            operator_delete(_Var15._M_p);
          }
        }
        bVar6 = Directory::FileIsDirectory(&local_d0,i);
        bVar7 = Directory::FileIsSymlink(&local_d0,i);
        if (bVar6) {
          if (bVar7) {
            if (this->RecurseThroughSymlinks != true) goto LAB_0015ea18;
            if (bVar7) {
              this->FollowedSymlinkCount = this->FollowedSymlinkCount + 1;
              local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
              local_180._M_string_length = 0;
              local_180.field_2._M_allocated_capacity =
                   local_180.field_2._M_allocated_capacity & 0xffffffffffffff00;
              SystemTools::GetRealPath(&local_f0,local_160,&local_180);
              if (local_180._M_string_length == 0) {
                _Var12 = std::
                         __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                                   ((this->VisitedSymlinks).
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                                    (this->VisitedSymlinks).
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish,&local_f0);
                pbVar2 = (this->VisitedSymlinks).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
                if (_Var12._M_current == pbVar2) {
                  if (this->RecurseListDirs == true) {
                    AddFile(this,&this->Internals->Files,&local_110);
                  }
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::push_back(local_a8,&local_f0);
                  bVar6 = RecurseDirectory(this,local_a0,&local_110,messages);
                  pbVar4 = (this->VisitedSymlinks).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                  (this->VisitedSymlinks).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish = pbVar4 + -1;
                  puVar16 = (ulong *)pbVar4[-1]._M_dataplus._M_p;
                  if (!bVar6) {
                    local_50._M_dataplus._M_p = (pointer)puVar16;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)puVar16 != &pbVar4[-1].field_2) goto LAB_0015efde;
                    goto LAB_0015efe3;
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)puVar16 != &pbVar4[-1].field_2) goto LAB_0015ec72;
                }
                else if (messages != (GlobMessages *)0x0) {
                  local_150 = &local_140;
                  local_148 = 0;
                  local_140 = local_140 & 0xffffffffffffff00;
                  for (_Var12 = std::
                                __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                                          ((local_a8->
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )._M_impl.super__Vector_impl_data._M_start,pbVar2,
                                           &local_f0);
                      _Var12._M_current !=
                      (this->VisitedSymlinks).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
                      _Var12._M_current = _Var12._M_current + 1) {
                    pcVar1 = ((_Var12._M_current)->_M_dataplus)._M_p;
                    local_1a8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_198;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_1a8,pcVar1,
                               pcVar1 + (_Var12._M_current)->_M_string_length);
                    std::__cxx11::string::append((char *)&local_1a8);
                    std::__cxx11::string::_M_append((char *)&local_150,(ulong)local_1a8);
                    if (local_1a8 !=
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_198) {
                      operator_delete(local_1a8);
                    }
                  }
                  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_c8,local_f0._M_dataplus._M_p,
                             local_f0._M_dataplus._M_p + local_f0._M_string_length);
                  std::__cxx11::string::append((char *)&local_c8);
                  puVar13 = (undefined8 *)
                            std::__cxx11::string::_M_append
                                      ((char *)&local_c8,(ulong)local_130._M_dataplus._M_p);
                  psVar14 = puVar13 + 2;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar13 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)psVar14) {
                    local_198._0_8_ = *psVar14;
                    local_198._8_8_ = puVar13[3];
                    local_1a8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_198;
                  }
                  else {
                    local_198._0_8_ = *psVar14;
                    local_1a8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)*puVar13;
                  }
                  local_1a0._M_p = (pointer)puVar13[1];
                  *puVar13 = psVar14;
                  puVar13[1] = 0;
                  *(undefined1 *)(puVar13 + 2) = 0;
                  std::__cxx11::string::_M_append((char *)&local_150,(ulong)local_1a8);
                  if (local_1a8 !=
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_198) {
                    operator_delete(local_1a8);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
                    operator_delete(local_c8._M_dataplus._M_p);
                  }
                  local_1a8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)CONCAT44(local_1a8._4_4_,2);
                  local_1a0._M_p = local_198 + 8;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_1a0,local_150,local_148 + (long)local_150);
                  std::vector<kwssys::Glob::Message,_std::allocator<kwssys::Glob::Message>_>::
                  emplace_back<kwssys::Glob::Message>(messages,(Message *)&local_1a8);
                  if (local_1a0._M_p != local_198 + 8) {
                    operator_delete(local_1a0._M_p);
                  }
                  puVar16 = local_150;
                  if (local_150 != &local_140) {
LAB_0015ec72:
                    operator_delete(puVar16);
                  }
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
                  operator_delete(local_f0._M_dataplus._M_p);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_180._M_dataplus._M_p != &local_180.field_2) {
                  operator_delete(local_180._M_dataplus._M_p);
                }
                goto LAB_0015eaa3;
              }
              if (messages != (GlobMessages *)0x0) {
                std::operator+(&local_50,"Canonical path generation from path \'",local_160);
                plVar10 = (long *)std::__cxx11::string::append((char *)&local_50);
                psVar14 = (size_type *)(plVar10 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar10 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar14) {
                  local_70.field_2._M_allocated_capacity = *psVar14;
                  local_70.field_2._8_8_ = plVar10[3];
                  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
                }
                else {
                  local_70.field_2._M_allocated_capacity = *psVar14;
                  local_70._M_dataplus._M_p = (pointer)*plVar10;
                }
                local_70._M_string_length = plVar10[1];
                *plVar10 = (long)psVar14;
                plVar10[1] = 0;
                *(undefined1 *)(plVar10 + 2) = 0;
                std::operator+(&local_c8,&local_70,&local_180);
                plVar10 = (long *)std::__cxx11::string::append((char *)&local_c8);
                puVar16 = (ulong *)(plVar10 + 2);
                if ((ulong *)*plVar10 == puVar16) {
                  local_140 = *puVar16;
                  uStack_138 = (undefined4)plVar10[3];
                  uStack_134 = *(undefined4 *)((long)plVar10 + 0x1c);
                  local_150 = &local_140;
                }
                else {
                  local_140 = *puVar16;
                  local_150 = (ulong *)*plVar10;
                }
                local_148 = plVar10[1];
                *plVar10 = (long)puVar16;
                plVar10[1] = 0;
                *(undefined1 *)(plVar10 + 2) = 0;
                local_1a8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)((ulong)local_1a8 & 0xffffffff00000000);
                local_1a0._M_p = local_198 + 8;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_1a0,local_150,local_148 + (long)local_150);
                std::vector<kwssys::Glob::Message,_std::allocator<kwssys::Glob::Message>_>::
                emplace_back<kwssys::Glob::Message>(messages,(Message *)&local_1a8);
                if (local_1a0._M_p != local_198 + 8) {
                  operator_delete(local_1a0._M_p);
                }
                if (local_150 != &local_140) {
                  operator_delete(local_150);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
                  operator_delete(local_c8._M_dataplus._M_p);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_70._M_dataplus._M_p != &local_70.field_2) {
                  operator_delete(local_70._M_dataplus._M_p);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_50._M_dataplus._M_p != &local_50.field_2) {
LAB_0015efde:
                  operator_delete(local_50._M_dataplus._M_p);
                }
              }
LAB_0015efe3:
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
                operator_delete(local_f0._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_180._M_dataplus._M_p != &local_180.field_2) {
                operator_delete(local_180._M_dataplus._M_p);
              }
              break;
            }
          }
          if (this->RecurseListDirs == true) {
            AddFile(this,&this->Internals->Files,&local_110);
          }
          bVar6 = RecurseDirectory(this,local_a0,&local_110,messages);
          if (!bVar6) break;
        }
        else {
LAB_0015ea18:
          pRVar3 = (this->Internals->Expressions).
                   super__Vector_base<kwssys::RegularExpression,_std::allocator<kwssys::RegularExpression>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if (((this->Internals->Expressions).
               super__Vector_base<kwssys::RegularExpression,_std::allocator<kwssys::RegularExpression>_>
               ._M_impl.super__Vector_impl_data._M_start != pRVar3) &&
             (this_00 = pRVar3 + -1,
             bVar17 = RegularExpression::find(this_00,local_130._M_dataplus._M_p,&this_00->regmatch)
             , bVar17)) {
            AddFile(this,&this->Internals->Files,&local_110);
          }
        }
      }
LAB_0015eaa3:
      local_158 = local_158 + 1;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p);
    }
    local_f0._M_dataplus._M_p = local_110._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p == &local_110.field_2) goto LAB_0015f049;
  }
  else {
    bVar17 = true;
    if ((messages == (GlobMessages *)0x0) || (local_90._M_string_length == 0)) goto LAB_0015f049;
    std::operator+(&local_f0,"Error listing directory \'",local_160);
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_f0);
    puVar16 = (ulong *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar16) {
      local_180.field_2._M_allocated_capacity = *puVar16;
      local_180.field_2._8_8_ = plVar10[3];
      local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
    }
    else {
      local_180.field_2._M_allocated_capacity = *puVar16;
      local_180._M_dataplus._M_p = (pointer)*plVar10;
    }
    local_180._M_string_length = plVar10[1];
    *plVar10 = (long)puVar16;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::_M_append
                                ((char *)&local_180,(ulong)local_90._M_dataplus._M_p);
    puVar16 = (ulong *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar16) {
      local_130.field_2._M_allocated_capacity = *puVar16;
      local_130.field_2._8_8_ = plVar10[3];
      local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    }
    else {
      local_130.field_2._M_allocated_capacity = *puVar16;
      local_130._M_dataplus._M_p = (pointer)*plVar10;
    }
    local_130._M_string_length = plVar10[1];
    *plVar10 = (long)puVar16;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_130);
    puVar16 = (ulong *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar16) {
      local_110.field_2._M_allocated_capacity = *puVar16;
      local_110.field_2._8_4_ = (undefined4)plVar10[3];
      local_110.field_2._12_4_ = *(undefined4 *)((long)plVar10 + 0x1c);
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    }
    else {
      local_110.field_2._M_allocated_capacity = *puVar16;
      local_110._M_dataplus._M_p = (pointer)*plVar10;
    }
    local_110._M_string_length = plVar10[1];
    *plVar10 = (long)puVar16;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    local_1a8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(local_1a8._4_4_,1);
    local_1a0._M_p = local_198 + 8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1a0,local_110._M_dataplus._M_p,
               local_110._M_dataplus._M_p + local_110._M_string_length);
    std::vector<kwssys::Glob::Message,_std::allocator<kwssys::Glob::Message>_>::
    emplace_back<kwssys::Glob::Message>(messages,(Message *)&local_1a8);
    if (local_1a0._M_p != local_198 + 8) {
      operator_delete(local_1a0._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180._M_dataplus._M_p != &local_180.field_2) {
      operator_delete(local_180._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p == &local_f0.field_2) goto LAB_0015f049;
  }
  operator_delete(local_f0._M_dataplus._M_p);
LAB_0015f049:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  Directory::~Directory(&local_d0);
  return bVar17;
}

Assistant:

bool Glob::RecurseDirectory(std::string::size_type start,
                            const std::string& dir, GlobMessages* messages)
{
  kwsys::Directory d;
  std::string errorMessage;
  if (!d.Load(dir, &errorMessage)) {
    if (messages) {
      if (!errorMessage.empty()) {
        messages->push_back(Message(Glob::warning,
                                    "Error listing directory '" + dir +
                                      "'! Reason: '" + errorMessage + "'"));
      }
    }
    return true;
  }
  unsigned long cc;
  std::string realname;
  std::string fname;
  for (cc = 0; cc < d.GetNumberOfFiles(); cc++) {
    fname = d.GetFile(cc);
    if (fname == "." || fname == "..") {
      continue;
    }

    if (start == 0) {
      realname = dir + fname;
    } else {
      realname = dir + "/" + fname;
    }

#if defined(KWSYS_GLOB_CASE_INDEPENDENT)
    // On Windows and Apple, no difference between lower and upper case
    fname = kwsys::SystemTools::LowerCase(fname);
#endif

    bool isDir = d.FileIsDirectory(cc);
    bool isSymLink = d.FileIsSymlink(cc);

    if (isDir && (!isSymLink || this->RecurseThroughSymlinks)) {
      if (isSymLink) {
        ++this->FollowedSymlinkCount;
        std::string realPathErrorMessage;
        std::string canonicalPath(
          SystemTools::GetRealPath(dir, &realPathErrorMessage));

        if (!realPathErrorMessage.empty()) {
          if (messages) {
            messages->push_back(
              Message(Glob::error,
                      "Canonical path generation from path '" + dir +
                        "' failed! Reason: '" + realPathErrorMessage + "'"));
          }
          return false;
        }

        if (std::find(this->VisitedSymlinks.begin(),
                      this->VisitedSymlinks.end(),
                      canonicalPath) == this->VisitedSymlinks.end()) {
          if (this->RecurseListDirs) {
            // symlinks are treated as directories
            this->AddFile(this->Internals->Files, realname);
          }

          this->VisitedSymlinks.push_back(canonicalPath);
          if (!this->RecurseDirectory(start + 1, realname, messages)) {
            this->VisitedSymlinks.pop_back();

            return false;
          }
          this->VisitedSymlinks.pop_back();
        }
        // else we have already visited this symlink - prevent cyclic recursion
        else if (messages) {
          std::string message;
          for (std::vector<std::string>::const_iterator pathIt =
                 std::find(this->VisitedSymlinks.begin(),
                           this->VisitedSymlinks.end(), canonicalPath);
               pathIt != this->VisitedSymlinks.end(); ++pathIt) {
            message += *pathIt + "\n";
          }
          message += canonicalPath + "/" + fname;
          messages->push_back(Message(Glob::cyclicRecursion, message));
        }
      } else {
        if (this->RecurseListDirs) {
          this->AddFile(this->Internals->Files, realname);
        }
        if (!this->RecurseDirectory(start + 1, realname, messages)) {
          return false;
        }
      }
    } else {
      if (!this->Internals->Expressions.empty() &&
          this->Internals->Expressions.back().find(fname)) {
        this->AddFile(this->Internals->Files, realname);
      }
    }
  }

  return true;
}